

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryTableExpr
          (BinaryReaderIR *this,Type sig_type,CatchClauseVector *catches)

{
  Index IVar1;
  pointer pCVar2;
  char *pcVar3;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar4;
  Location *pLVar5;
  Result RVar6;
  Result RVar7;
  Expr *pEVar8;
  CatchClause *raw_catch;
  pointer pCVar9;
  Location loc;
  Location local_178;
  Expr *local_158;
  Location *local_150;
  pointer local_148;
  _Head_base<0UL,_wabt::Expr_*,_false> local_140;
  TableCatch local_138;
  Var local_78;
  
  pEVar8 = (Expr *)operator_new(0x130);
  (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar8->loc).filename._M_len = 0;
  (pEVar8->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(pEVar8->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar8->loc).field_1.field_1.offset + 4) = 0;
  pEVar8->type_ = TryTable;
  pEVar8->_vptr_Expr = (_func_int **)&PTR__TryTableExpr_001a2700;
  pEVar8[1]._vptr_Expr = (_func_int **)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_;
  pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined1 *)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  *(undefined1 *)&pEVar8[1].loc.filename._M_str = 0;
  Var::Var((Var *)&pEVar8[1].loc.field_1.field_0);
  pEVar8[4]._vptr_Expr = (_func_int **)0x0;
  pEVar8[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar8[3].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar8[3].type_ = 0;
  pEVar8[3].loc.filename._M_str = (char *)0x0;
  pEVar8[3].loc.field_1.field_1.offset = 0;
  pEVar8[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  pEVar8[3].loc.filename._M_len = 0;
  pEVar8[3]._vptr_Expr = (_func_int **)0x0;
  pEVar8[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar8[2].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar8[2].type_ = 0;
  *(undefined4 *)&pEVar8[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  pEVar8[4].loc.filename._M_len = 0;
  pEVar8[4].loc.filename._M_str = (char *)0x0;
  pEVar8[4].loc.field_1.field_1.offset = 0;
  local_158 = pEVar8;
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::reserve
            ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)&pEVar8[4].loc,
             ((long)(catches->
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(catches->
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  SetBlockDeclaration(this,(BlockDeclaration *)&pEVar8[1].loc.filename._M_str,sig_type);
  pCVar9 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = &pEVar8[4].loc;
  if (pCVar9 != pCVar2) {
    do {
      local_148 = pCVar2;
      local_150 = pLVar5;
      local_138.loc.field_1.field_0.line = 0;
      local_138.loc.field_1._4_8_ = 0;
      local_138.loc.filename._M_len = 0;
      local_138.loc.filename._M_str._0_4_ = 0;
      local_138.loc.filename._M_str._4_4_ = 0;
      Var::Var(&local_138.tag);
      Var::Var(&local_138.target);
      local_138.kind = pCVar9->kind;
      IVar1 = pCVar9->tag;
      pcVar3 = this->filename_;
      aVar4.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_178.field_1.field_0.last_column = 0;
      local_178.filename._M_len = strlen(pcVar3);
      local_178.filename._M_str = pcVar3;
      local_178.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar4.offset;
      Var::Var(&local_78,IVar1,&local_178);
      Var::operator=(&local_138.tag,&local_78);
      Var::~Var(&local_78);
      IVar1 = pCVar9->depth;
      pcVar3 = this->filename_;
      aVar4.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_178.field_1.field_0.last_column = 0;
      local_178.filename._M_len = strlen(pcVar3);
      pLVar5 = local_150;
      local_178.filename._M_str = pcVar3;
      local_178.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar4.offset;
      Var::Var(&local_78,IVar1,&local_178);
      Var::operator=(&local_138.target,&local_78);
      Var::~Var(&local_78);
      std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::
      emplace_back<wabt::TableCatch>
                ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)pLVar5,&local_138);
      Var::~Var(&local_138.target);
      Var::~Var(&local_138.tag);
      pCVar9 = pCVar9 + 1;
      pLVar5 = local_150;
      pCVar2 = local_148;
    } while (pCVar9 != local_148);
  }
  pEVar8 = local_158;
  local_140._M_head_impl = local_158;
  RVar6 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_140);
  if (local_140._M_head_impl != (Expr *)0x0) {
    (*(local_140._M_head_impl)->_vptr_Expr[1])();
  }
  RVar7.enum_ = Error;
  if (RVar6.enum_ != Error) {
    (this->module_->features_used).exceptions = true;
    RVar7 = PushLabel(this,TryTable,(ExprList *)&pEVar8[3].loc.filename._M_str,pEVar8);
  }
  return (Result)RVar7.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryTableExpr(Type sig_type,
                                      const CatchClauseVector& catches) {
  auto expr_ptr = std::make_unique<TryTableExpr>();
  TryTableExpr* expr = expr_ptr.get();
  expr->catches.reserve(catches.size());
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;

  for (auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    expr->catches.push_back(std::move(catch_));
  }

  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::TryTable, expr_list, expr);
}